

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_geninfo.c
# Opt level: O3

int metaConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  
  if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
  }
  else {
    if (type != 0) {
      iVar1 = _mpt_geninfo_conv(val + 1,type,ptr);
      return iVar1;
    }
    if (ptr != (void *)0x0) {
      *(char **)ptr = "s";
    }
  }
  return 0;
}

Assistant:

static int metaConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	const void *info = val + 1;
	void **dest = ptr;
	
	if (!type) {
		static const char types[] = { 's', 0 };
		if (dest) *dest = (void *) types;
		return 0;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (dest) *dest = (void *) val;
		return 0;
	}
	return _mpt_geninfo_conv(info, type, ptr);
}